

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O2

void ZSTD_rescaleFreqs(optState_t *optPtr,BYTE *src,size_t srcSize,int optLevel)

{
  short sVar1;
  ZSTD_entropyCTables_t *symbolTable;
  uint *puVar2;
  byte bVar3;
  U32 UVar4;
  undefined8 in_RAX;
  long lVar5;
  ulong uVar6;
  long lVar7;
  uint uVar8;
  uint uVar9;
  uint lit;
  long lVar10;
  undefined8 uStack_28;
  uint lit_1;
  
  optPtr->priceType = zop_dynamic;
  uStack_28 = in_RAX;
  if (optPtr->litLengthSum == 0) {
    if (srcSize < 0x401) {
      optPtr->priceType = zop_predef;
    }
    if ((optPtr->symbolCosts->huf).repeatMode == HUF_repeat_valid) {
      optPtr->priceType = zop_dynamic;
      optPtr->litSum = 0;
      lVar10 = 0;
      while( true ) {
        symbolTable = optPtr->symbolCosts;
        if (lVar10 == 0x100) break;
        UVar4 = HUF_getNbBits(symbolTable,(U32)lVar10);
        uVar9 = 1 << (0xbU - (char)UVar4 & 0x1f);
        if (UVar4 == 0) {
          uVar9 = 1;
        }
        optPtr->litFreq[lVar10] = uVar9;
        optPtr->litSum = optPtr->litSum + uVar9;
        lVar10 = lVar10 + 1;
      }
      sVar1 = (short)(symbolTable->fse).litlengthCTable[0];
      lVar10 = 1;
      lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      if (sVar1 == 0) {
        lVar5 = lVar10;
      }
      optPtr->litLengthSum = 0;
      puVar2 = optPtr->litLengthFreq;
      for (lVar7 = 0; lVar7 != 0x24; lVar7 = lVar7 + 1) {
        uVar8 = (symbolTable->fse).litlengthCTable[lVar5 + lVar7 * 2 + 2] + 0xffff;
        uVar9 = 1 << (10U - (char)(uVar8 >> 0x10) & 0x1f);
        if (uVar8 < 0x10000) {
          uVar9 = 1;
        }
        puVar2[lVar7] = uVar9;
        optPtr->litLengthSum = optPtr->litLengthSum + uVar9;
      }
      sVar1 = (short)(symbolTable->fse).matchlengthCTable[0];
      lVar5 = (long)(1 << ((char)sVar1 - 1U & 0x1f));
      if (sVar1 == 0) {
        lVar5 = lVar10;
      }
      optPtr->matchLengthSum = 0;
      puVar2 = optPtr->matchLengthFreq;
      for (lVar7 = 0; lVar7 != 0x35; lVar7 = lVar7 + 1) {
        uVar9 = (symbolTable->fse).matchlengthCTable[lVar5 + lVar7 * 2 + 2] + 0xffff;
        uVar8 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar8 = 1;
        }
        puVar2[lVar7] = uVar8;
        optPtr->matchLengthSum = optPtr->matchLengthSum + uVar8;
      }
      sVar1 = (short)(symbolTable->fse).offcodeCTable[0];
      bVar3 = (char)sVar1 - 1U & 0x1f;
      lVar5 = (long)(1 << bVar3);
      if (sVar1 == 0) {
        lVar5 = lVar10;
      }
      optPtr->offCodeSum = 0;
      puVar2 = optPtr->offCodeFreq;
      for (uVar6 = (ulong)(uint)(0 << bVar3); uVar6 != 0x20; uVar6 = uVar6 + 1) {
        uVar9 = (symbolTable->fse).offcodeCTable[lVar5 + uVar6 * 2 + 2] + 0xffff;
        uVar8 = 1 << (10U - (char)(uVar9 >> 0x10) & 0x1f);
        if (uVar9 < 0x10000) {
          uVar8 = 1;
        }
        puVar2[uVar6] = uVar8;
        optPtr->offCodeSum = optPtr->offCodeSum + uVar8;
      }
      goto LAB_003c24ec;
    }
    uStack_28 = CONCAT44(0xff,(int)in_RAX);
    HIST_count_simple(optPtr->litFreq,&lit_1,src,srcSize);
    UVar4 = ZSTD_downscaleStat(optPtr->litFreq,0xff,1);
    optPtr->litSum = UVar4;
    puVar2 = optPtr->litLengthFreq;
    for (lVar10 = 0; lVar10 != 0x24; lVar10 = lVar10 + 1) {
      puVar2[lVar10] = 1;
    }
    optPtr->litLengthSum = 0x24;
    puVar2 = optPtr->matchLengthFreq;
    for (lVar10 = 0; lVar10 != 0x35; lVar10 = lVar10 + 1) {
      puVar2[lVar10] = 1;
    }
    optPtr->matchLengthSum = 0x35;
    puVar2 = optPtr->offCodeFreq;
    UVar4 = 0x20;
    for (lVar10 = 0; lVar10 != 0x20; lVar10 = lVar10 + 1) {
      puVar2[lVar10] = 1;
    }
  }
  else {
    UVar4 = ZSTD_downscaleStat(optPtr->litFreq,0xff,1);
    optPtr->litSum = UVar4;
    UVar4 = ZSTD_downscaleStat(optPtr->litLengthFreq,0x23,0);
    optPtr->litLengthSum = UVar4;
    UVar4 = ZSTD_downscaleStat(optPtr->matchLengthFreq,0x34,0);
    optPtr->matchLengthSum = UVar4;
    UVar4 = ZSTD_downscaleStat(optPtr->offCodeFreq,0x1f,0);
  }
  optPtr->offCodeSum = UVar4;
LAB_003c24ec:
  ZSTD_setBasePrices(optPtr,optLevel);
  return;
}

Assistant:

static void
ZSTD_rescaleFreqs(optState_t* const optPtr,
            const BYTE* const src, size_t const srcSize,
                  int const optLevel)
{
    DEBUGLOG(5, "ZSTD_rescaleFreqs (srcSize=%u)", (unsigned)srcSize);
    optPtr->priceType = zop_dynamic;

    if (optPtr->litLengthSum == 0) {  /* first block : init */
        if (srcSize <= ZSTD_PREDEF_THRESHOLD) {  /* heuristic */
            DEBUGLOG(5, "(srcSize <= ZSTD_PREDEF_THRESHOLD) => zop_predef");
            optPtr->priceType = zop_predef;
        }

        assert(optPtr->symbolCosts != NULL);
        if (optPtr->symbolCosts->huf.repeatMode == HUF_repeat_valid) {
            /* huffman table presumed generated by dictionary */
            optPtr->priceType = zop_dynamic;

            assert(optPtr->litFreq != NULL);
            optPtr->litSum = 0;
            {   unsigned lit;
                for (lit=0; lit<=MaxLit; lit++) {
                    U32 const scaleLog = 11;   /* scale to 2K */
                    U32 const bitCost = HUF_getNbBits(optPtr->symbolCosts->huf.CTable, lit);
                    assert(bitCost <= scaleLog);
                    optPtr->litFreq[lit] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litSum += optPtr->litFreq[lit];
            }   }

            {   unsigned ll;
                FSE_CState_t llstate;
                FSE_initCState(&llstate, optPtr->symbolCosts->fse.litlengthCTable);
                optPtr->litLengthSum = 0;
                for (ll=0; ll<=MaxLL; ll++) {
                    U32 const scaleLog = 10;   /* scale to 1K */
                    U32 const bitCost = FSE_getMaxNbBits(llstate.symbolTT, ll);
                    assert(bitCost < scaleLog);
                    optPtr->litLengthFreq[ll] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->litLengthSum += optPtr->litLengthFreq[ll];
            }   }

            {   unsigned ml;
                FSE_CState_t mlstate;
                FSE_initCState(&mlstate, optPtr->symbolCosts->fse.matchlengthCTable);
                optPtr->matchLengthSum = 0;
                for (ml=0; ml<=MaxML; ml++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(mlstate.symbolTT, ml);
                    assert(bitCost < scaleLog);
                    optPtr->matchLengthFreq[ml] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->matchLengthSum += optPtr->matchLengthFreq[ml];
            }   }

            {   unsigned of;
                FSE_CState_t ofstate;
                FSE_initCState(&ofstate, optPtr->symbolCosts->fse.offcodeCTable);
                optPtr->offCodeSum = 0;
                for (of=0; of<=MaxOff; of++) {
                    U32 const scaleLog = 10;
                    U32 const bitCost = FSE_getMaxNbBits(ofstate.symbolTT, of);
                    assert(bitCost < scaleLog);
                    optPtr->offCodeFreq[of] = bitCost ? 1 << (scaleLog-bitCost) : 1 /*minimum to calculate cost*/;
                    optPtr->offCodeSum += optPtr->offCodeFreq[of];
            }   }

        } else {  /* not a dictionary */

            assert(optPtr->litFreq != NULL);
            {   unsigned lit = MaxLit;
                HIST_count_simple(optPtr->litFreq, &lit, src, srcSize);   /* use raw first block to init statistics */
            }
            optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);

            {   unsigned ll;
                for (ll=0; ll<=MaxLL; ll++)
                    optPtr->litLengthFreq[ll] = 1;
            }
            optPtr->litLengthSum = MaxLL+1;

            {   unsigned ml;
                for (ml=0; ml<=MaxML; ml++)
                    optPtr->matchLengthFreq[ml] = 1;
            }
            optPtr->matchLengthSum = MaxML+1;

            {   unsigned of;
                for (of=0; of<=MaxOff; of++)
                    optPtr->offCodeFreq[of] = 1;
            }
            optPtr->offCodeSum = MaxOff+1;

        }

    } else {   /* new block : re-use previous statistics, scaled down */

        optPtr->litSum = ZSTD_downscaleStat(optPtr->litFreq, MaxLit, 1);
        optPtr->litLengthSum = ZSTD_downscaleStat(optPtr->litLengthFreq, MaxLL, 0);
        optPtr->matchLengthSum = ZSTD_downscaleStat(optPtr->matchLengthFreq, MaxML, 0);
        optPtr->offCodeSum = ZSTD_downscaleStat(optPtr->offCodeFreq, MaxOff, 0);
    }

    ZSTD_setBasePrices(optPtr, optLevel);
}